

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

InternalRunDeathTestFlag * testing::internal::ParseInternalRunDeathTestFlag(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  InternalRunDeathTestFlag *this;
  undefined8 extraout_RAX;
  void *unaff_R14;
  string local_78;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  int local_34;
  int local_30;
  int line;
  int index;
  int write_fd;
  
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &FLAGS_gtest_internal_run_death_test_abi_cxx11_,"");
  if (bVar4) {
    return (InternalRunDeathTestFlag *)0x0;
  }
  local_34 = -1;
  local_30 = -1;
  auStack_58 = (undefined1  [8])0x0;
  fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,FLAGS_gtest_internal_run_death_test_abi_cxx11_,
             (allocator<char> *)&line);
  SplitString(&local_78,'|',
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_58);
  std::__cxx11::string::~string((string *)&local_78);
  line = -1;
  if (((((long)fields.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 == 0x80) &&
       (bVar4 = ParseNaturalNumber<int>((string *)((long)auStack_58 + 0x20),&local_34), bVar4)) &&
      (bVar4 = ParseNaturalNumber<int>((string *)((long)auStack_58 + 0x40),&local_30), bVar4)) &&
     (bVar4 = ParseNaturalNumber<int>((string *)((long)auStack_58 + 0x60),&line), bVar4)) {
    this = (InternalRunDeathTestFlag *)operator_new(0x30);
    iVar3 = line;
    iVar2 = local_30;
    iVar1 = local_34;
    std::__cxx11::string::string
              ((string *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58);
    this->line_ = iVar1;
    this->index_ = iVar2;
    this->write_fd_ = iVar3;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_58);
    return this;
  }
  std::operator+(&local_78,"Bad --gtest_internal_run_death_test flag: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FLAGS_gtest_internal_run_death_test_abi_cxx11_);
  DeathTestAbort(&local_78);
  operator_delete(unaff_R14,0x30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

InternalRunDeathTestFlag* ParseInternalRunDeathTestFlag() {
  if (GTEST_FLAG(internal_run_death_test) == "") return NULL;

  // GTEST_HAS_DEATH_TEST implies that we have ::std::string, so we
  // can use it here.
  int line = -1;
  int index = -1;
  ::std::vector< ::std::string> fields;
  SplitString(GTEST_FLAG(internal_run_death_test).c_str(), '|', &fields);
  int write_fd = -1;

# if GTEST_OS_WINDOWS

  unsigned int parent_process_id = 0;
  size_t write_handle_as_size_t = 0;
  size_t event_handle_as_size_t = 0;

  if (fields.size() != 6
      || !ParseNaturalNumber(fields[1], &line)
      || !ParseNaturalNumber(fields[2], &index)
      || !ParseNaturalNumber(fields[3], &parent_process_id)
      || !ParseNaturalNumber(fields[4], &write_handle_as_size_t)
      || !ParseNaturalNumber(fields[5], &event_handle_as_size_t)) {
    DeathTestAbort("Bad --gtest_internal_run_death_test flag: " +
                   GTEST_FLAG(internal_run_death_test));
  }
  write_fd = GetStatusFileDescriptor(parent_process_id,
                                     write_handle_as_size_t,
                                     event_handle_as_size_t);
# else

  if (fields.size() != 4
      || !ParseNaturalNumber(fields[1], &line)
      || !ParseNaturalNumber(fields[2], &index)
      || !ParseNaturalNumber(fields[3], &write_fd)) {
    DeathTestAbort("Bad --gtest_internal_run_death_test flag: "
        + GTEST_FLAG(internal_run_death_test));
  }

# endif  // GTEST_OS_WINDOWS

  return new InternalRunDeathTestFlag(fields[0], line, index, write_fd);
}